

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_stristr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  sxi32 sVar2;
  char *zString;
  char *pPattern;
  uint nLen_00;
  sxu32 nOfft;
  int nLen;
  int nPatLen;
  sxu32 local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  if (1 < nArg) {
    zString = jx9_value_to_string(*apArg,(int *)&local_38);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_34);
    local_3c = 0;
    if ((0 < (int)local_34 && 0 < (int)local_38) &&
       (sVar2 = iPatternMatch(zString,local_38,pPattern,local_34,&local_3c), sVar2 == 0)) {
      if ((nArg == 2) ||
         (pjVar1 = apArg[2], jx9MemObjToInteger(pjVar1), nLen_00 = local_3c, *(int *)&pjVar1->x == 0
         )) {
        zString = zString + local_3c;
        nLen_00 = local_38 - local_3c;
      }
      jx9_value_string(pCtx->pRet,zString,nLen_00);
      return 0;
    }
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).rVal = 0.0;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_stristr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = iPatternMatch; /* Case-insensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	if( nLen > 0 && nPatLen > 0 ){
		int before = 0;
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the portion of the string */
		if( nArg > 2 ){
			before = jx9_value_to_int(apArg[2]);
		}
		if( before ){
			jx9_result_string(pCtx, zBlob, (int)(&zBlob[nOfft]-zBlob));
		}else{
			jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
		}
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}